

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall polyscope::SlicePlane::setTransform(SlicePlane *this,mat4 newTransform)

{
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_00000078;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *in_stack_00000080;
  
  PersistentValue<glm::mat<4,4,float,(glm::qualifier)0>>::operator=
            (in_stack_00000080,in_stack_00000078);
  requestRedraw();
  return;
}

Assistant:

void SlicePlane::setTransform(glm::mat4 newTransform) {
  objectTransform = newTransform;
  polyscope::requestRedraw();
}